

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_layer<ncnn::ReLU>
              (char *layer_type,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights
              ,Option *_opt,Mat *a,float epsilon,_func_void_ReLU_ptr *func)

{
  int iVar1;
  pointer *ppMVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar3;
  Mat *pMVar4;
  void *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  undefined8 in_RDI;
  pointer in_R9;
  float in_XMM0_Da;
  int ret;
  Mat top_shape;
  Mat tmp_3;
  size_t j_1;
  Mat tmp_2;
  Mat tmp_1;
  size_t j;
  Mat tmp;
  float epsilon_fp16;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights_fp16;
  Mat a_fp16;
  Option *opt;
  int i;
  Option *in_stack_00000660;
  Mat *in_stack_00000668;
  Mat *in_stack_00000670;
  pointer in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  Mat *in_stack_fffffffffffffd48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffd50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this;
  pointer *local_298;
  Mat local_288;
  Allocator *in_stack_fffffffffffffdd8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffde0;
  Mat *local_208;
  Mat local_200;
  Mat local_1c0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_180;
  Mat local_168;
  float local_124;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_120;
  Mat local_108;
  long local_c8;
  int local_bc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_b8;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 auStack_90 [20];
  float in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined5 in_stack_ffffffffffffff93;
  Option *in_stack_ffffffffffffff98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffffa0;
  ParamDict *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int local_4;
  
  this = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffffc0;
  ppMVar2 = (pointer *)&local_b8;
  do {
    local_298 = ppMVar2;
    ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    ppMVar2 = &(((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_298 + 3))->
               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  } while ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)ppMVar2 != this);
  memcpy(&local_b8,in_RCX,0x24);
  local_97 = 0;
  local_9c = 0;
  local_9b = 0;
  local_96 = 0;
  memcpy(auStack_90,in_RCX,0x24);
  uVar7 = 1;
  uVar5 = 1;
  uVar6 = 0;
  uVar8 = 1;
  memcpy(&stack0xffffffffffffff98,in_RCX,0x24);
  in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
  local_bc = 0;
  while( true ) {
    if (2 < local_bc) {
      return 0;
    }
    local_c8 = (long)&local_b8 + (long)local_bc * 0x28;
    ncnn::Mat::Mat(&local_108);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x117f50);
    if (((*(byte *)(local_c8 + 0x1c) & 1) == 0) && ((*(byte *)(local_c8 + 0x1d) & 1) == 0)) {
      if ((*(byte *)(local_c8 + 0x23) & 1) == 0) {
        ncnn::Mat::operator=
                  (in_stack_fffffffffffffd48,
                   (Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                  (in_stack_fffffffffffffde0,
                   (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffdd8);
        local_124 = in_XMM0_Da;
      }
      else {
        ncnn::Mat::Mat(&local_200);
        ncnn::cast_float32_to_bfloat16(in_stack_00000670,in_stack_00000668,in_stack_00000660);
        ncnn::cast_bfloat16_to_float32(in_stack_00000670,in_stack_00000668,in_stack_00000660);
        ncnn::Mat::~Mat((Mat *)0x1181a3);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(this,(size_type)local_298);
        local_208 = (Mat *)0x0;
        while (in_stack_fffffffffffffd48 = local_208,
              pMVar4 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX),
              in_stack_fffffffffffffd48 < pMVar4) {
          ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffdb8);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                    (in_RDX,(size_type)local_208);
          ncnn::cast_float32_to_bfloat16(in_stack_00000670,in_stack_00000668,in_stack_00000660);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                    (&local_120,(size_type)local_208);
          ncnn::cast_bfloat16_to_float32(in_stack_00000670,in_stack_00000668,in_stack_00000660);
          ncnn::Mat::~Mat((Mat *)0x118273);
          local_208 = (Mat *)((long)&local_208->data + 1);
        }
        local_124 = in_XMM0_Da * 100.0;
      }
    }
    else {
      ncnn::Mat::Mat(&local_168);
      ncnn::cast_float32_to_float16(in_stack_00000670,in_stack_00000668,in_stack_00000660);
      ncnn::cast_float16_to_float32(in_stack_00000670,in_stack_00000668,in_stack_00000660);
      ncnn::Mat::~Mat((Mat *)0x117fca);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(this,(size_type)local_298);
      local_180 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
      while (in_stack_fffffffffffffd50 = local_180,
            pvVar3 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                     std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX),
            in_stack_fffffffffffffd50 < pvVar3) {
        ncnn::Mat::Mat(&local_1c0);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(size_type)local_180);
        ncnn::cast_float32_to_float16(in_stack_00000670,in_stack_00000668,in_stack_00000660);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                  (&local_120,(size_type)local_180);
        ncnn::cast_float16_to_float32(in_stack_00000670,in_stack_00000668,in_stack_00000660);
        ncnn::Mat::~Mat((Mat *)0x11809a);
        local_180 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                    ((long)&(local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_124 = in_XMM0_Da * 100.0;
    }
    ncnn::Mat::Mat(&local_288);
    in_stack_fffffffffffffd44 = ncnn::layer_to_index((char *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd38 = in_R9;
    in_R9 = in_stack_fffffffffffffd38;
    iVar1 = test_layer<ncnn::ReLU>
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff98,
                       (Mat *)CONCAT53(in_stack_ffffffffffffff93,
                                       CONCAT12(uVar8,CONCAT11(uVar7,in_stack_ffffffffffffff90))),
                       (Mat *)CONCAT26(in_stack_ffffffffffffff8e,
                                       CONCAT15(uVar6,CONCAT14(uVar5,in_stack_ffffffffffffff88))),
                       in_stack_ffffffffffffff84,(_func_void_ReLU_ptr *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd40 = iVar1;
    if (iVar1 != 0) {
      in_stack_fffffffffffffd38 =
           (pointer)CONCAT44((int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             (uint)(*(byte *)(local_c8 + 0x23) & 1));
      fprintf(_stderr,
              "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n"
              ,in_RDI,(ulong)(*(byte *)(local_c8 + 0x21) & 1),
              (ulong)(*(byte *)(local_c8 + 0x1c) & 1),(ulong)(*(byte *)(local_c8 + 0x22) & 1));
      local_4 = iVar1;
    }
    ncnn::Mat::~Mat((Mat *)0x11845f);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(in_stack_fffffffffffffd50);
    ncnn::Mat::~Mat((Mat *)0x118479);
    if (iVar1 != 0) break;
    local_bc = local_bc + 1;
  }
  return local_4;
}

Assistant:

int test_layer(const char* layer_type, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Option opts[3];
    opts[0] = _opt;
    opts[0].use_packing_layout = false;
    opts[0].use_fp16_packed = false;
    opts[0].use_fp16_storage = false;
    opts[0].use_shader_pack8 = false;
    opts[1] = _opt;
    opts[1].use_packing_layout = true;
    opts[1].use_fp16_packed = true;
    opts[1].use_fp16_storage = false;
    opts[1].use_shader_pack8 = true;
    opts[2] = _opt;
    opts[2].use_packing_layout = true;
    opts[2].use_vulkan_compute = false;
    opts[2].use_fp16_packed = false;
    opts[2].use_fp16_storage = false;
    opts[2].use_bf16_storage = true;

    for (int i = 0; i < 3; i++)
    {
        const ncnn::Option& opt = opts[i];

        // fp16 representation
        ncnn::Mat a_fp16;
        std::vector<ncnn::Mat> weights_fp16;
        float epsilon_fp16;
        if (opt.use_fp16_packed || opt.use_fp16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(a, tmp, opt);
                ncnn::cast_float16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(weights[j], tmp, opt);
                ncnn::cast_float16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else if (opt.use_bf16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(a, tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(weights[j], tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else
        {
            a_fp16 = a;
            weights_fp16 = weights;
            epsilon_fp16 = epsilon;
        }

        ncnn::Mat top_shape;
        int ret = test_layer<T>(ncnn::layer_to_index(layer_type), pd, weights_fp16, opt, a_fp16, top_shape, epsilon_fp16, func);
        if (ret != 0)
        {
            fprintf(stderr, "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n", layer_type, opt.use_packing_layout, opt.use_fp16_packed, opt.use_shader_pack8, opt.use_bf16_storage);
            return ret;
        }
    }

    return 0;
}